

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O2

void WebPInitConvertARGBToYUV(void)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)
                             &WebPInitConvertARGBToYUV::WebPInitConvertARGBToYUV_body_lock);
  if (iVar1 != 0) {
    return;
  }
  if (WebPInitConvertARGBToYUV::WebPInitConvertARGBToYUV_body_last_cpuinfo_used != VP8GetCPUInfo) {
    WebPConvertARGBToY = ConvertARGBToY_C;
    WebPConvertARGBToUV = WebPConvertARGBToUV_C;
    WebPConvertRGB24ToY = ConvertRGB24ToY_C;
    WebPConvertBGR24ToY = ConvertBGR24ToY_C;
    WebPConvertRGBA32ToUV = WebPConvertRGBA32ToUV_C;
    WebPSharpYUVUpdateY = SharpYUVUpdateY_C;
    WebPSharpYUVUpdateRGB = SharpYUVUpdateRGB_C;
    WebPSharpYUVFilterRow = SharpYUVFilterRow_C;
    if (VP8GetCPUInfo != (VP8CPUInfo)0x0) {
      iVar1 = (*VP8GetCPUInfo)(kSSE2);
      if (iVar1 != 0) {
        WebPInitConvertARGBToYUVSSE2();
        WebPInitSharpYUVSSE2();
      }
      iVar1 = (*VP8GetCPUInfo)(kSSE4_1);
      if (iVar1 != 0) {
        WebPInitConvertARGBToYUVSSE41();
      }
    }
  }
  WebPInitConvertARGBToYUV::WebPInitConvertARGBToYUV_body_last_cpuinfo_used = VP8GetCPUInfo;
  pthread_mutex_unlock
            ((pthread_mutex_t *)&WebPInitConvertARGBToYUV::WebPInitConvertARGBToYUV_body_lock);
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(WebPInitConvertARGBToYUV) {
  WebPConvertARGBToY = ConvertARGBToY_C;
  WebPConvertARGBToUV = WebPConvertARGBToUV_C;

  WebPConvertRGB24ToY = ConvertRGB24ToY_C;
  WebPConvertBGR24ToY = ConvertBGR24ToY_C;

  WebPConvertRGBA32ToUV = WebPConvertRGBA32ToUV_C;

#if !WEBP_NEON_OMIT_C_CODE
  WebPSharpYUVUpdateY = SharpYUVUpdateY_C;
  WebPSharpYUVUpdateRGB = SharpYUVUpdateRGB_C;
  WebPSharpYUVFilterRow = SharpYUVFilterRow_C;
#endif

  if (VP8GetCPUInfo != NULL) {
#if defined(WEBP_HAVE_SSE2)
    if (VP8GetCPUInfo(kSSE2)) {
      WebPInitConvertARGBToYUVSSE2();
      WebPInitSharpYUVSSE2();
    }
#endif  // WEBP_HAVE_SSE2
#if defined(WEBP_HAVE_SSE41)
    if (VP8GetCPUInfo(kSSE4_1)) {
      WebPInitConvertARGBToYUVSSE41();
    }
#endif  // WEBP_HAVE_SSE41
  }

#if defined(WEBP_HAVE_NEON)
  if (WEBP_NEON_OMIT_C_CODE ||
      (VP8GetCPUInfo != NULL && VP8GetCPUInfo(kNEON))) {
    WebPInitConvertARGBToYUVNEON();
    WebPInitSharpYUVNEON();
  }
#endif  // WEBP_HAVE_NEON

  assert(WebPConvertARGBToY != NULL);
  assert(WebPConvertARGBToUV != NULL);
  assert(WebPConvertRGB24ToY != NULL);
  assert(WebPConvertBGR24ToY != NULL);
  assert(WebPConvertRGBA32ToUV != NULL);
  assert(WebPSharpYUVUpdateY != NULL);
  assert(WebPSharpYUVUpdateRGB != NULL);
  assert(WebPSharpYUVFilterRow != NULL);
}